

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O1

double __thiscall COLLADABU::Math::Quaternion::log(Quaternion *this,double __x)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double *in_RSI;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  
  this->y = 0.0;
  this->z = 0.0;
  this->w = 0.0;
  this->x = 0.0;
  if (ABS(*in_RSI) < 1.0) {
    dVar7 = acos(*in_RSI);
    dVar2 = sin(dVar7);
    if (0.001 <= ABS(dVar2)) {
      dVar7 = dVar7 / dVar2;
      auVar1 = *(undefined1 (*) [16])(in_RSI + 1);
      uVar5 = auVar1._0_4_;
      uVar6 = auVar1._4_4_;
      this->x = dVar7 * auVar1._0_8_;
      this->y = dVar7 * auVar1._8_8_;
      dVar7 = dVar7 * in_RSI[3];
      goto LAB_0083e001;
    }
  }
  uVar5 = *(undefined4 *)(in_RSI + 1);
  uVar6 = *(undefined4 *)((long)in_RSI + 0xc);
  uVar3 = *(undefined4 *)(in_RSI + 2);
  uVar4 = *(undefined4 *)((long)in_RSI + 0x14);
  *(undefined4 *)&this->x = uVar5;
  *(undefined4 *)((long)&this->x + 4) = uVar6;
  *(undefined4 *)&this->y = uVar3;
  *(undefined4 *)((long)&this->y + 4) = uVar4;
  dVar7 = in_RSI[3];
LAB_0083e001:
  this->z = dVar7;
  return (double)CONCAT44(uVar6,uVar5);
}

Assistant:

Quaternion Quaternion::log () const
        {
            // If q = cos(A)+sin(A)*(x*i+y*j+z*k) where (x,y,z) is unit length, then
            // log(q) = A*(x*i+y*j+z*k).  If sin(A) is near zero, use log(q) =
            // sin(A)*(x*i+y*j+z*k) since sin(A)/A has limit 1.

            Quaternion kResult;
            kResult.w = 0.0;

            if ( std::abs( w ) < 1.0 )
            {
                Real fAngle_radian ( acos( w ) );
                Real fSin = sin( fAngle_radian );

                if ( std::abs( fSin ) >= ms_fEpsilon )
                {
                    Real fCoeff = fAngle_radian / fSin;
                    kResult.x = fCoeff * x;
                    kResult.y = fCoeff * y;
                    kResult.z = fCoeff * z;
                    return kResult;
                }
            }

            kResult.x = x;
            kResult.y = y;
            kResult.z = z;

            return kResult;
        }